

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ResolveMessageType
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          Type *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  int iVar1;
  long lVar2;
  Rep *pRVar3;
  once_flag *poVar4;
  pointer pcVar5;
  StringPiece error_message;
  bool bVar6;
  Field *pFVar7;
  LogMessage *other;
  EnumValueDescriptor *pEVar8;
  Descriptor *pDVar9;
  undefined8 *puVar10;
  EnumDescriptor *pEVar11;
  SourceContext *pSVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  RepeatedPtrField<google::protobuf::Option> *output;
  long lVar15;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX_00;
  RepeatedPtrField<google::protobuf::Option> *output_00;
  Arena *initial_value;
  Arena *pAVar16;
  char *pcVar17;
  string *psVar18;
  ArenaStringPtr *this_01;
  long lVar19;
  undefined1 local_110 [8];
  Status status;
  string type_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  Descriptor *local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_50;
  
  status.error_message_.field_2._8_8_ = &type_name._M_string_length;
  type_name._M_dataplus._M_p = (pointer)0x0;
  type_name._M_string_length._0_1_ = 0;
  ParseTypeUrl((Status *)local_110,this,type_url,
               (string *)((long)&status.error_message_.field_2 + 8));
  if (local_110._0_4_ == OK) {
    local_a0 = DescriptorPool::FindMessageTypeByName
                         (this->pool_,(string *)((long)&status.error_message_.field_2 + 8));
    if (local_a0 == (Descriptor *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "Invalid type URL, unknown type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&status.error_message_.field_2 + 8));
      error_message.length_ = (stringpiece_ssize_type)__str._M_dataplus._M_p;
      error_message.ptr_ = (char *)local_98;
      if ((long)__str._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)__str._M_dataplus._M_p,"size_t to int conversion");
      }
      Status::Status(__return_storage_ptr__,NOT_FOUND,error_message);
      if (local_98 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)local_98);
      }
    }
    else {
      Type::Clear(type);
      pAVar16 = (Arena *)(type->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar16 & 1) != 0) {
        pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
      }
      psVar18 = (type->name_).ptr_;
      if (psVar18 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        protobuf::internal::ArenaStringPtr::CreateInstance
                  (&type->name_,pAVar16,*(string **)(local_a0 + 8));
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar18);
      }
      if (0 < *(int *)(local_a0 + 0x68)) {
        lVar19 = 0;
        lVar15 = 0;
        do {
          lVar2 = *(long *)(local_a0 + 0x28);
          pRVar3 = (type->fields_).super_RepeatedPtrFieldBase.rep_;
          type_name.field_2._8_8_ = lVar15;
          if (pRVar3 == (Rep *)0x0) {
LAB_00339f7d:
            protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (&(type->fields_).super_RepeatedPtrFieldBase,
                       (type->fields_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00339f92:
            pRVar3 = (type->fields_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            pFVar7 = Arena::CreateMaybeMessage<google::protobuf::Field>
                               ((type->fields_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (type->fields_).super_RepeatedPtrFieldBase.rep_;
            iVar1 = (type->fields_).super_RepeatedPtrFieldBase.current_size_;
            (type->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
            pRVar3->elements[iVar1] = pFVar7;
          }
          else {
            iVar1 = (type->fields_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar1) {
              if (pRVar3->allocated_size == (type->fields_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00339f7d;
              goto LAB_00339f92;
            }
            (type->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
            pFVar7 = (Field *)pRVar3->elements[iVar1];
          }
          this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(lVar2 + lVar19);
          poVar4 = *(once_flag **)(lVar2 + 0x30 + lVar19);
          if (poVar4 != (once_flag *)0x0) {
            local_98 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
            local_50._M_dataplus._M_p = (pointer)this_00;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar4,(_func_void_FieldDescriptor_ptr **)local_98,
                       (FieldDescriptor **)&local_50);
          }
          pFVar7->kind_ = *(int *)(lVar2 + 0x38 + lVar19);
          iVar1 = *(int *)(lVar2 + 0x3c + lVar19);
          if (iVar1 - 1U < 3) {
            pFVar7->cardinality_ = iVar1;
          }
          pFVar7->number_ = *(int32 *)(lVar2 + 0x44 + lVar19);
          pAVar16 = (Arena *)(pFVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar16 & 1) != 0) {
            pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
          }
          psVar18 = (pFVar7->name_).ptr_;
          if (psVar18 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            protobuf::internal::ArenaStringPtr::CreateInstance
                      (&pFVar7->name_,pAVar16,*(string **)(lVar2 + lVar19));
          }
          else {
            std::__cxx11::string::_M_assign((string *)psVar18);
          }
          pAVar16 = (Arena *)(pFVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar16 & 1) != 0) {
            pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
          }
          initial_value = *(Arena **)(lVar2 + 0x20 + lVar19);
          psVar18 = (pFVar7->json_name_).ptr_;
          if (psVar18 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            protobuf::internal::ArenaStringPtr::CreateInstance
                      (&pFVar7->json_name_,pAVar16,(string *)initial_value);
          }
          else {
            std::__cxx11::string::_M_assign((string *)psVar18);
            pAVar16 = initial_value;
          }
          if (*(char *)(lVar2 + 0x40 + lVar19) == '\x01') {
            poVar4 = *(once_flag **)(lVar2 + 0x30 + lVar19);
            if (poVar4 != (once_flag *)0x0) {
              local_98 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
              pAVar16 = (Arena *)local_98;
              local_a8 = this_00;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar4,(_func_void_FieldDescriptor_ptr **)pAVar16,
                         (FieldDescriptor **)&local_a8);
            }
            switch(*(undefined4 *)
                    (FieldDescriptor::kTypeToCppTypeMap +
                    (ulong)*(uint *)(lVar2 + 0x38 + lVar19) * 4)) {
            case 1:
              local_98 = (undefined1  [8])&__str._M_string_length;
              pcVar17 = FastInt32ToBufferLeft(*(int32 *)(lVar2 + 0x90 + lVar19),(char *)local_98);
              __str._M_dataplus._M_p = pcVar17 + -(long)&__str._M_string_length;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_98,__str._M_dataplus._M_p + (long)local_98);
              break;
            case 2:
              local_98 = (undefined1  [8])&__str._M_string_length;
              pcVar17 = FastInt64ToBufferLeft(*(int64 *)(lVar2 + 0x90 + lVar19),(char *)local_98);
              __str._M_dataplus._M_p = pcVar17 + -(long)&__str._M_string_length;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_98,__str._M_dataplus._M_p + (long)local_98);
              break;
            case 3:
              local_98 = (undefined1  [8])&__str._M_string_length;
              pcVar17 = FastUInt32ToBufferLeft(*(uint32 *)(lVar2 + 0x90 + lVar19),(char *)local_98);
              __str._M_dataplus._M_p = pcVar17 + -(long)&__str._M_string_length;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_98,__str._M_dataplus._M_p + (long)local_98);
              break;
            case 4:
              local_98 = (undefined1  [8])&__str._M_string_length;
              pcVar17 = FastUInt64ToBufferLeft(*(uint64 *)(lVar2 + 0x90 + lVar19),(char *)local_98);
              __str._M_dataplus._M_p = pcVar17 + -(long)&__str._M_string_length;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_98,__str._M_dataplus._M_p + (long)local_98);
              break;
            case 5:
              SimpleDtoa_abi_cxx11_
                        (&local_50,(protobuf *)pAVar16,*(double *)(lVar2 + 0x90 + lVar19));
              break;
            case 6:
              SimpleFtoa_abi_cxx11_(&local_50,(protobuf *)pAVar16,*(float *)(lVar2 + 0x90 + lVar19))
              ;
              break;
            case 7:
              uVar14 = (ulong)*(byte *)(lVar2 + 0x90 + lVar19);
              pcVar17 = "false";
              if (uVar14 != 0) {
                pcVar17 = "true";
              }
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,pcVar17,pcVar17 + (uVar14 ^ 5));
              break;
            case 8:
              pEVar8 = FieldDescriptor::default_value_enum((FieldDescriptor *)this_00->_M_local_buf)
              ;
              psVar18 = *(string **)pEVar8;
LAB_0033a33e:
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              pcVar5 = (psVar18->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar5,pcVar5 + psVar18->_M_string_length);
              break;
            case 9:
              poVar4 = *(once_flag **)(lVar2 + 0x30 + lVar19);
              if (poVar4 != (once_flag *)0x0) {
                local_98 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
                local_a8 = this_00;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (poVar4,(_func_void_FieldDescriptor_ptr **)local_98,
                           (FieldDescriptor **)&local_a8);
              }
              psVar18 = *(string **)(lVar2 + 0x90 + lVar19);
              if (*(int *)(lVar2 + 0x38 + lVar19) != 0xc) goto LAB_0033a33e;
              CEscape(&local_50,psVar18);
              break;
            case 10:
              protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_98,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/type_resolver_util.cc"
                         ,0x161);
              other = protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_98,"Messages can\'t have default values!");
              protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
              protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_98);
            default:
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              local_50._M_string_length = 0;
              local_50.field_2._M_allocated_capacity =
                   local_50.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            pAVar16 = (Arena *)(pFVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)pAVar16 & 1) != 0) {
              pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
            }
            psVar18 = (pFVar7->default_value_).ptr_;
            if (psVar18 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              protobuf::internal::ArenaStringPtr::CreateInstance
                        (&pFVar7->default_value_,pAVar16,&local_50);
            }
            else {
              std::__cxx11::string::_M_assign((string *)psVar18);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          poVar4 = *(once_flag **)(lVar2 + 0x30 + lVar19);
          if (poVar4 != (once_flag *)0x0) {
            local_98 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
            local_50._M_dataplus._M_p = (pointer)this_00;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar4,(_func_void_FieldDescriptor_ptr **)local_98,
                       (FieldDescriptor **)&local_50);
          }
          if (*(int *)(lVar2 + 0x38 + lVar19) == 0xb) {
LAB_0033a417:
            pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this_00->_M_local_buf);
            local_98 = (undefined1  [8])&__str._M_string_length;
            pcVar5 = (this->url_prefix_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_98,pcVar5,pcVar5 + (this->url_prefix_)._M_string_length);
            std::__cxx11::string::append(local_98);
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append(local_98,**(ulong **)(pDVar9 + 8));
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar13) {
              local_50.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_50.field_2._8_8_ = puVar10[3];
            }
            else {
              local_50.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_50._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_50._M_string_length = puVar10[1];
            *puVar10 = paVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            if (local_98 != (undefined1  [8])&__str._M_string_length) {
              operator_delete((void *)local_98);
            }
            pAVar16 = (Arena *)(pFVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)pAVar16 & 1) != 0) {
              pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
            }
            psVar18 = (pFVar7->type_url_).ptr_;
            if (psVar18 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              protobuf::internal::ArenaStringPtr::CreateInstance
                        (&pFVar7->type_url_,pAVar16,&local_50);
            }
            else {
              std::__cxx11::string::_M_assign((string *)psVar18);
            }
LAB_0033a62d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          else {
            poVar4 = *(once_flag **)(lVar2 + 0x30 + lVar19);
            if (poVar4 != (once_flag *)0x0) {
              local_98 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
              local_50._M_dataplus._M_p = (pointer)this_00;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar4,(_func_void_FieldDescriptor_ptr **)local_98,
                         (FieldDescriptor **)&local_50);
            }
            if (*(int *)(lVar2 + 0x38 + lVar19) == 10) goto LAB_0033a417;
            poVar4 = *(once_flag **)(lVar2 + 0x30 + lVar19);
            if (poVar4 != (once_flag *)0x0) {
              local_98 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
              local_50._M_dataplus._M_p = (pointer)this_00;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar4,(_func_void_FieldDescriptor_ptr **)local_98,
                         (FieldDescriptor **)&local_50);
            }
            if (*(int *)(lVar2 + 0x38 + lVar19) == 0xe) {
              pEVar11 = FieldDescriptor::enum_type((FieldDescriptor *)this_00->_M_local_buf);
              local_98 = (undefined1  [8])&__str._M_string_length;
              pcVar5 = (this->url_prefix_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_98,pcVar5,pcVar5 + (this->url_prefix_)._M_string_length);
              std::__cxx11::string::append(local_98);
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append(local_98,**(ulong **)(pEVar11 + 8));
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar13) {
                local_50.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_50.field_2._8_8_ = puVar10[3];
              }
              else {
                local_50.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_50._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_50._M_string_length = puVar10[1];
              *puVar10 = paVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              if (local_98 != (undefined1  [8])&__str._M_string_length) {
                operator_delete((void *)local_98);
              }
              pAVar16 = (Arena *)(pFVar7->super_Message).super_MessageLite._internal_metadata_.ptr_;
              if (((ulong)pAVar16 & 1) != 0) {
                pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
              }
              psVar18 = (pFVar7->type_url_).ptr_;
              if (psVar18 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                protobuf::internal::ArenaStringPtr::CreateInstance
                          (&pFVar7->type_url_,pAVar16,&local_50);
              }
              else {
                std::__cxx11::string::_M_assign((string *)psVar18);
              }
              goto LAB_0033a62d;
            }
          }
          lVar15 = *(long *)(lVar2 + 0x58 + lVar19);
          if (lVar15 != 0) {
            pFVar7->oneof_index_ =
                 (int)((ulong)(lVar15 - *(long *)(*(long *)(lVar15 + 0x10) + 0x30)) >> 4) *
                 -0x55555555 + 1;
          }
          bVar6 = FieldDescriptor::is_packed((FieldDescriptor *)this_00->_M_local_buf);
          if (bVar6) {
            pFVar7->packed_ = true;
          }
          ConvertOptionsInternal
                    (*(DescriptorPoolTypeResolver **)(lVar2 + 0x78 + lVar19),
                     (Message *)&pFVar7->options_,output);
          lVar15 = type_name.field_2._8_8_ + 1;
          lVar19 = lVar19 + 0x98;
        } while (lVar15 < *(int *)(local_a0 + 0x68));
      }
      pDVar9 = local_a0;
      if (0 < *(int *)(local_a0 + 0x6c)) {
        lVar15 = 0;
        lVar19 = 0;
        do {
          Type::add_oneofs(type,*(string **)(*(long *)(pDVar9 + 0x30) + lVar15));
          lVar19 = lVar19 + 1;
          lVar15 = lVar15 + 0x30;
        } while (lVar19 < *(int *)(pDVar9 + 0x6c));
      }
      if (type->source_context_ == (SourceContext *)0x0) {
        pAVar16 = (Arena *)(type->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar16 & 1) != 0) {
          pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
        }
        pSVar12 = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar16);
        type->source_context_ = pSVar12;
      }
      pAVar16 = (Arena *)(type->source_context_->super_Message).super_MessageLite.
                         _internal_metadata_.ptr_;
      this_01 = &type->source_context_->file_name_;
      if (((ulong)pAVar16 & 1) != 0) {
        pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
      }
      psVar18 = this_01->ptr_;
      if (psVar18 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        protobuf::internal::ArenaStringPtr::CreateInstance
                  (this_01,pAVar16,(string *)**(undefined8 **)(local_a0 + 0x10));
        output_00 = extraout_RDX_00;
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar18);
        output_00 = extraout_RDX;
      }
      ConvertOptionsInternal
                (*(DescriptorPoolTypeResolver **)(local_a0 + 0x20),(Message *)&type->options_,
                 output_00);
      Status::Status(__return_storage_ptr__);
    }
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_110);
  }
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  if ((size_type *)status.error_message_.field_2._8_8_ != &type_name._M_string_length) {
    operator_delete((void *)status.error_message_.field_2._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ResolveMessageType(const std::string& type_url, Type* type) override {
    std::string type_name;
    Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const Descriptor* descriptor = pool_->FindMessageTypeByName(type_name);
    if (descriptor == NULL) {
      return Status(util::error::NOT_FOUND,
                    "Invalid type URL, unknown type: " + type_name);
    }
    ConvertDescriptor(descriptor, type);
    return Status();
  }